

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setQuery(QUrl *this,QString *query,ParsingMode mode)

{
  bool bVar1;
  int in_EDX;
  QString *in_RSI;
  QUrlPrivate *in_RDI;
  QUrlPrivate *unaff_retaddr;
  QString *in_stack_ffffffffffffffd8;
  QUrlPrivate *pQVar2;
  Section section;
  
  pQVar2 = in_RDI;
  detach((QUrl *)in_RSI);
  section = (Section)((ulong)pQVar2 >> 0x38);
  QUrlPrivate::clearError((QUrlPrivate *)0x2fc6c2);
  QUrlPrivate::setQuery<QString_const&>(in_RDI,in_stack_ffffffffffffffd8,TolerantMode);
  bVar1 = QString::isNull((QString *)0x2fc6e2);
  if (bVar1) {
    *(byte *)(*(long *)in_RDI + 0xb8) = *(byte *)(*(long *)in_RDI + 0xb8) & 0xbf;
  }
  else if ((in_EDX == 1) &&
          (bVar1 = QUrlPrivate::validateComponent(unaff_retaddr,section,in_RSI), !bVar1)) {
    QString::clear((QString *)in_RDI);
  }
  return;
}

Assistant:

void QUrl::setQuery(const QString &query, ParsingMode mode)
{
    detach();
    d->clearError();

    d->setQuery(query, mode);
    if (query.isNull())
        d->sectionIsPresent &= ~QUrlPrivate::Query;
    else if (mode == StrictMode && !d->validateComponent(QUrlPrivate::Query, query))
        d->query.clear();
}